

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fighterquietus.cpp
# Opt level: O1

int AF_A_FSwordFlames(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  PClass *pPVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  undefined8 uVar9;
  PClass *pPVar10;
  PClassActor *type;
  int iVar11;
  char *__assertion;
  bool bVar12;
  DVector2 v;
  FName local_58;
  undefined4 uStack_54;
  double dStack_50;
  DVector3 local_48;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005b4ccd;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    puVar2 = (undefined8 *)(param->field_0).field_1.a;
    if (puVar2 != (undefined8 *)0x0) {
      if (puVar2[1] == 0) {
        uVar9 = (**(code **)*puVar2)(puVar2);
        puVar2[1] = uVar9;
      }
      pPVar10 = (PClass *)puVar2[1];
      bVar12 = pPVar10 != (PClass *)0x0;
      if (pPVar10 != pPVar4 && bVar12) {
        do {
          pPVar10 = pPVar10->ParentClass;
          bVar12 = pPVar10 != (PClass *)0x0;
          if (pPVar10 == pPVar4) break;
        } while (pPVar10 != (PClass *)0x0);
      }
      if (!bVar12) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005b4ccd;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005b4ca2;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar9 = (**(code **)*puVar3)(puVar3);
          puVar3[1] = uVar9;
        }
        pPVar10 = (PClass *)puVar3[1];
        bVar12 = pPVar10 != (PClass *)0x0;
        if (pPVar10 != pPVar4 && bVar12) {
          do {
            pPVar10 = pPVar10->ParentClass;
            bVar12 = pPVar10 != (PClass *)0x0;
            if (pPVar10 == pPVar4) break;
          } while (pPVar10 != (PClass *)0x0);
        }
        if (!bVar12) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005b4ccd;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      uVar5 = FRandom::GenRand32(&pr_fswordflame);
      iVar11 = (uVar5 & 3) + 1;
      do {
        uVar5 = FRandom::GenRand32(&pr_fswordflame);
        uVar6 = FRandom::GenRand32(&pr_fswordflame);
        uVar7 = FRandom::GenRand32(&pr_fswordflame);
        iVar8 = FName::NameManager::FindName(&FName::NameData,"FSwordFlame",false);
        P_GetOffsetPosition((double)puVar2[9],(double)puVar2[10],
                            (double)(int)((uVar5 & 0xff) - 0x80) * 0.0625,
                            (double)(int)((uVar6 & 0xff) - 0x80) * 0.0625);
        local_48.Z = (double)(int)((uVar7 & 0xff) - 0x80) * 0.125 + (double)puVar2[0xb];
        local_48.X = (double)CONCAT44(uStack_54,local_58.Index);
        local_48.Y = dStack_50;
        local_58.Index = iVar8;
        type = ClassForSpawn(&local_58);
        AActor::StaticSpawn(type,&local_48,ALLOW_REPLACE,false);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005b4ca2:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005b4ccd:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fighterquietus.cpp"
                ,0x70,"int AF_A_FSwordFlames(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FSwordFlames)
{
	PARAM_ACTION_PROLOGUE;

	int i;

	for (i = 1+(pr_fswordflame()&3); i; i--)
	{
		double xo = (pr_fswordflame() - 128) / 16.;
		double yo = (pr_fswordflame() - 128) / 16.;
		double zo = (pr_fswordflame() - 128) / 8.;
		Spawn ("FSwordFlame", self->Vec3Offset(xo, yo, zo), ALLOW_REPLACE);
	}
	return 0;
}